

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

void ppc_cpu_exec_enter(CPUState *cs)

{
  CPUState *cs_local;
  
  return;
}

Assistant:

static void ppc_cpu_exec_enter(CPUState *cs)
{
#if 0
    PowerPCCPU *cpu = POWERPC_CPU(cs);

    if (cpu->vhyp) {
        PPCVirtualHypervisorClass *vhc =
            PPC_VIRTUAL_HYPERVISOR_GET_CLASS(cpu->vhyp);
        vhc->cpu_exec_enter(cpu->vhyp, cpu);
    }
#endif
}